

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fTextureBorderClampTests.cpp
# Opt level: O0

ReferenceParams * __thiscall
deqp::gles31::Functional::anon_unknown_1::TextureBorderClampPerAxisCase3D::getSamplerParams
          (ReferenceParams *__return_storage_ptr__,TextureBorderClampPerAxisCase3D *this)

{
  SamplerType SVar1;
  Texture3D *this_00;
  Texture3D *this_01;
  TextureFormat *pTVar2;
  Sampler local_5c;
  TextureFormat local_20;
  TextureFormat texFormat;
  TextureBorderClampPerAxisCase3D *this_local;
  ReferenceParams *refParams;
  
  texFormat = (TextureFormat)this;
  this_00 = de::details::UniqueBase<glu::Texture3D,_de::DefaultDeleter<glu::Texture3D>_>::operator->
                      (&(this->m_texture).
                        super_UniqueBase<glu::Texture3D,_de::DefaultDeleter<glu::Texture3D>_>);
  this_01 = glu::Texture3D::getRefTexture(this_00);
  pTVar2 = tcu::TextureLevelPyramid::getFormat(&this_01->super_TextureLevelPyramid);
  local_20 = *pTVar2;
  glu::TextureTestUtil::ReferenceParams::ReferenceParams(__return_storage_ptr__,TEXTURETYPE_3D);
  glu::mapGLSampler(&local_5c,this->m_sWrap,this->m_tWrap,this->m_rWrap,this->m_filter,
                    this->m_filter);
  tcu::Sampler::operator=(&__return_storage_ptr__->sampler,&local_5c);
  rr::GenericVec4::operator=(&(__return_storage_ptr__->sampler).borderColor,&this->m_borderColor);
  __return_storage_ptr__->lodMode = LODMODE_EXACT;
  SVar1 = glu::TextureTestUtil::getSamplerType(local_20);
  (__return_storage_ptr__->super_RenderParams).samplerType = SVar1;
  *(undefined8 *)(__return_storage_ptr__->super_RenderParams).colorScale.m_data =
       *(undefined8 *)(this->m_lookupScale).m_data;
  *(undefined8 *)((__return_storage_ptr__->super_RenderParams).colorScale.m_data + 2) =
       *(undefined8 *)((this->m_lookupScale).m_data + 2);
  *(undefined8 *)(__return_storage_ptr__->super_RenderParams).colorBias.m_data =
       *(undefined8 *)(this->m_lookupBias).m_data;
  *(undefined8 *)((__return_storage_ptr__->super_RenderParams).colorBias.m_data + 2) =
       *(undefined8 *)((this->m_lookupBias).m_data + 2);
  return __return_storage_ptr__;
}

Assistant:

glu::TextureTestUtil::ReferenceParams TextureBorderClampPerAxisCase3D::getSamplerParams (void) const
{
	const tcu::TextureFormat				texFormat		= m_texture->getRefTexture().getFormat();
	glu::TextureTestUtil::ReferenceParams	refParams		(glu::TextureTestUtil::TEXTURETYPE_3D);

	refParams.sampler					= glu::mapGLSampler(m_sWrap, m_tWrap, m_rWrap, m_filter, m_filter);
	refParams.sampler.borderColor		= m_borderColor;
	refParams.lodMode					= glu::TextureTestUtil::LODMODE_EXACT;
	refParams.samplerType				= glu::TextureTestUtil::getSamplerType(texFormat);
	refParams.colorScale				= m_lookupScale;
	refParams.colorBias					= m_lookupBias;

	return refParams;
}